

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

void __thiscall cppcms::crypto::anon_unknown_3::sha1_digets::readout(sha1_digets *this,void *ptr)

{
  undefined4 uVar1;
  undefined1 *puVar2;
  undefined1 *in_RSI;
  long in_RDI;
  uint block;
  uint i;
  uchar *out;
  uint digets [5];
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar3;
  sha1 *in_stack_ffffffffffffffd0;
  undefined4 local_28 [6];
  undefined1 *local_10;
  
  local_10 = in_RSI;
  impl::sha1::get_digest
            (in_stack_ffffffffffffffd0,
             (digest_type)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  impl::sha1::reset((sha1 *)(in_RDI + 8));
  for (uVar3 = 0; uVar3 < 5; uVar3 = uVar3 + 1) {
    uVar1 = local_28[uVar3];
    *local_10 = (char)((uint)uVar1 >> 0x18);
    local_10[1] = (char)((uint)uVar1 >> 0x10);
    puVar2 = local_10 + 3;
    local_10[2] = (char)((uint)uVar1 >> 8);
    local_10 = local_10 + 4;
    *puVar2 = (char)uVar1;
  }
  return;
}

Assistant:

virtual void readout(void *ptr)
			{
				unsigned digets[5];
				state_.get_digest(digets);
				state_.reset();
				unsigned char *out = reinterpret_cast<unsigned char *>(ptr);
				for(unsigned i=0;i<5;i++) {
					unsigned block = digets[i];
					*out ++ = (block >> 24u) & 0xFFu;
					*out ++ = (block >> 16u) & 0xFFu;
					*out ++ = (block >>  8u) & 0xFFu;
					*out ++ = (block >>  0u) & 0xFFu;
				}
			}